

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmarker.c
# Opt level: O1

void write_frame_header(j_compress_ptr cinfo)

{
  jpeg_error_mgr *pjVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int *piVar5;
  JPEG_MARKER code;
  int iVar6;
  int iVar7;
  bool bVar8;
  
  iVar4 = cinfo->num_components;
  bVar3 = false;
  if (iVar4 < 1) {
    bVar8 = false;
  }
  else {
    piVar5 = &cinfo->comp_info->quant_tbl_no;
    iVar7 = 0;
    iVar6 = 0;
    do {
      iVar4 = emit_dqt(cinfo,*piVar5);
      iVar7 = iVar7 + iVar4;
      iVar6 = iVar6 + 1;
      iVar4 = cinfo->num_components;
      piVar5 = piVar5 + 0x18;
    } while (iVar6 < iVar4);
    bVar8 = iVar7 != 0;
  }
  bVar2 = false;
  if ((((cinfo->arith_code == 0) && (bVar2 = bVar3, cinfo->progressive_mode == 0)) &&
      (cinfo->data_precision == 8)) && (cinfo->block_size == 8)) {
    if (iVar4 < 1) {
      bVar2 = true;
    }
    else {
      piVar5 = &cinfo->comp_info->ac_tbl_no;
      bVar2 = true;
      do {
        if ((1 < piVar5[-1]) || (1 < *piVar5)) {
          bVar2 = false;
        }
        piVar5 = piVar5 + 0x18;
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
    }
    if ((bool)(bVar8 & bVar2)) {
      pjVar1 = cinfo->err;
      pjVar1->msg_code = 0x4d;
      bVar2 = false;
      (*pjVar1->emit_message)((j_common_ptr)cinfo,0);
    }
  }
  if (cinfo->arith_code == 0) {
    code = M_SOF2;
    if (cinfo->progressive_mode == 0) {
      code = !bVar2 + M_SOF0;
    }
  }
  else {
    code = M_SOF10 - (cinfo->progressive_mode == 0);
  }
  emit_sof(cinfo,code);
  if ((cinfo->progressive_mode != 0) && (cinfo->block_size != 8)) {
    emit_byte(cinfo,0xff);
    emit_byte(cinfo,0xda);
    emit_byte(cinfo,0);
    emit_byte(cinfo,6);
    emit_byte(cinfo,0);
    emit_byte(cinfo,0);
    emit_byte(cinfo,cinfo->block_size * cinfo->block_size + -1);
    emit_byte(cinfo,0);
    return;
  }
  return;
}

Assistant:

METHODDEF(void)
write_frame_header (j_compress_ptr cinfo)
{
  int ci, prec;
  boolean is_baseline;
  jpeg_component_info *compptr;
  
  /* Emit DQT for each quantization table.
   * Note that emit_dqt() suppresses any duplicate tables.
   */
  prec = 0;
  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    prec += emit_dqt(cinfo, compptr->quant_tbl_no);
  }
  /* now prec is nonzero iff there are any 16-bit quant tables. */

  /* Check for a non-baseline specification.
   * Note we assume that Huffman table numbers won't be changed later.
   */
  if (cinfo->arith_code || cinfo->progressive_mode ||
      cinfo->data_precision != 8 || cinfo->block_size != DCTSIZE) {
    is_baseline = FALSE;
  } else {
    is_baseline = TRUE;
    for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
	 ci++, compptr++) {
      if (compptr->dc_tbl_no > 1 || compptr->ac_tbl_no > 1)
	is_baseline = FALSE;
    }
    if (prec && is_baseline) {
      is_baseline = FALSE;
      /* If it's baseline except for quantizer size, warn the user */
      TRACEMS(cinfo, 0, JTRC_16BIT_TABLES);
    }
  }

  /* Emit the proper SOF marker */
  if (cinfo->arith_code) {
    if (cinfo->progressive_mode)
      emit_sof(cinfo, M_SOF10); /* SOF code for progressive arithmetic */
    else
      emit_sof(cinfo, M_SOF9);  /* SOF code for sequential arithmetic */
  } else {
    if (cinfo->progressive_mode)
      emit_sof(cinfo, M_SOF2);	/* SOF code for progressive Huffman */
    else if (is_baseline)
      emit_sof(cinfo, M_SOF0);	/* SOF code for baseline implementation */
    else
      emit_sof(cinfo, M_SOF1);	/* SOF code for non-baseline Huffman file */
  }

  /* Check to emit pseudo SOS marker */
  if (cinfo->progressive_mode && cinfo->block_size != DCTSIZE)
    emit_pseudo_sos(cinfo);
}